

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QDebug operator<<(QDebug *debug,QMainWindowLayout *layout)

{
  QDockAreaLayout *in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebug *this;
  QDebug local_18;
  QDebug local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QDebug::QDebug(&local_18,in_RSI);
  this = &local_10;
  operator<<(in_RSI,in_RDX);
  QDebug::~QDebug(this);
  QDebug::~QDebug(&local_18);
  QDebug::QDebug(this,(QDebug *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QMainWindowLayout *layout)
{
    debug << layout->layoutState.dockAreaLayout;
    return debug;
}